

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EefcFlash.cpp
# Opt level: O0

void __thiscall EefcFlash::readPage(EefcFlash *this,uint32_t page,uint8_t *data)

{
  FlashPageError *this_00;
  uint32_t local_5c;
  uint32_t local_4c;
  uint8_t *data_local;
  uint32_t page_local;
  EefcFlash *this_local;
  
  if ((this->super_Flash)._pages <= page) {
    this_00 = (FlashPageError *)__cxa_allocate_exception(8);
    FlashPageError::FlashPageError(this_00);
    __cxa_throw(this_00,&FlashPageError::typeinfo,FlashPageError::~FlashPageError);
  }
  if (((this->super_Flash)._onBufferA & 1U) == 0) {
    local_4c = (this->super_Flash)._pageBufferB;
  }
  else {
    local_4c = (this->super_Flash)._pageBufferA;
  }
  WordCopyApplet::setDstAddr(&(this->super_Flash)._wordCopy,local_4c);
  WordCopyApplet::setSrcAddr
            (&(this->super_Flash)._wordCopy,
             (this->super_Flash)._addr + page * (this->super_Flash)._size);
  waitFSR(this,1);
  Applet::runv(&(this->super_Flash)._wordCopy.super_Applet);
  if (((this->super_Flash)._onBufferA & 1U) == 0) {
    local_5c = (this->super_Flash)._pageBufferB;
  }
  else {
    local_5c = (this->super_Flash)._pageBufferA;
  }
  Samba::read((this->super_Flash)._samba,local_5c,data,(ulong)(this->super_Flash)._size);
  return;
}

Assistant:

void
EefcFlash::readPage(uint32_t page, uint8_t* data)
{
    if (page >= _pages)
        throw FlashPageError();

    // The SAM3 firmware has a bug where it returns all zeros for reads
    // directly from the flash so instead, we copy the flash page to
    // SRAM and read it from there.
    _wordCopy.setDstAddr(_onBufferA ? _pageBufferA : _pageBufferB);
    _wordCopy.setSrcAddr(_addr + page * _size);
    waitFSR();
    _wordCopy.runv();
    _samba.read(_onBufferA ? _pageBufferA : _pageBufferB, data, _size);
}